

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_MockFailureTest_MockUnexpectedInputParameterFailure_Test::testBody
          (TEST_MockFailureTest_MockUnexpectedInputParameterFailure_Test *this)

{
  size_t *this_00;
  MockCheckedExpectedCall *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  undefined1 local_158 [40];
  MockUnexpectedInputParameterFailure failure;
  undefined1 local_c0 [8];
  MockNamedValue actualParameter;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_MockFailureTest_MockUnexpectedInputParameterFailure_Test *local_10;
  TEST_MockFailureTest_MockUnexpectedInputParameterFailure_Test *this_local;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call1;
  local_10 = this;
  SimpleString::SimpleString(&local_20,"foo");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&local_20);
  SimpleString::SimpleString(local_40,"boo");
  MockExpectedCall::withParameter((MockExpectedCall *)CONCAT44(extraout_var,iVar2),local_40,2);
  SimpleString::~SimpleString(local_40);
  SimpleString::~SimpleString(&local_20);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2;
  SimpleString::SimpleString(&local_50,"foo");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&local_50);
  SimpleString::SimpleString(&local_60,"boo");
  MockExpectedCall::withParameter((MockExpectedCall *)CONCAT44(extraout_var_00,iVar2),&local_60,3.3)
  ;
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_50);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call3;
  SimpleString::SimpleString((SimpleString *)&actualParameter.copier_,"unrelated");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&actualParameter.copier_);
  SimpleString::~SimpleString((SimpleString *)&actualParameter.copier_);
  TEST_GROUP_CppUTestGroupMockFailureTest::addThreeCallsToList
            (&this->super_TEST_GROUP_CppUTestGroupMockFailureTest);
  this_00 = &failure.super_MockFailure.super_TestFailure.message_.bufferSize_;
  SimpleString::SimpleString((SimpleString *)this_00,"bar");
  MockNamedValue::MockNamedValue((MockNamedValue *)local_c0,(SimpleString *)this_00);
  SimpleString::~SimpleString
            ((SimpleString *)&failure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  MockNamedValue::setValue((MockNamedValue *)local_c0,2);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString((SimpleString *)(local_158 + 0x10),"foo");
  MockUnexpectedInputParameterFailure::MockUnexpectedInputParameterFailure
            ((MockUnexpectedInputParameterFailure *)(local_158 + 0x20),pUVar3,
             (SimpleString *)(local_158 + 0x10),(MockNamedValue *)local_c0,
             (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).list);
  SimpleString::~SimpleString((SimpleString *)(local_158 + 0x10));
  pUVar3 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_158);
  pcVar4 = SimpleString::asCharString((SimpleString *)local_158);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,
             "Mock Failure: Unexpected parameter name to function \"foo\": bar\n\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n\t\tfoo -> int boo: <2 (0x2)> (expected 1 call, called 0 times)\n\t\tfoo -> double boo: <3.3> (expected 1 call, called 0 times)\n\tEXPECTED calls that WERE fulfilled related to function: foo\n\t\t<none>\n\tACTUAL unexpected parameter passed to function: foo\n\t\tint bar: <2 (0x2)>"
             ,pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockFailureTest.cpp"
             ,0xaf,pTVar5);
  SimpleString::~SimpleString((SimpleString *)local_158);
  MockUnexpectedInputParameterFailure::~MockUnexpectedInputParameterFailure
            ((MockUnexpectedInputParameterFailure *)(local_158 + 0x20));
  MockNamedValue::~MockNamedValue((MockNamedValue *)local_c0);
  return;
}

Assistant:

TEST(MockFailureTest, MockUnexpectedInputParameterFailure)
{
    call1->withName("foo").withParameter("boo", 2);
    call2->withName("foo").withParameter("boo", 3.3);
    call3->withName("unrelated");
    addThreeCallsToList();

    MockNamedValue actualParameter("bar");
    actualParameter.setValue(2);

    MockUnexpectedInputParameterFailure failure(UtestShell::getCurrent(), "foo", actualParameter, *list);
    STRCMP_EQUAL("Mock Failure: Unexpected parameter name to function \"foo\": bar\n"
                 "\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n"
                 "\t\tfoo -> int boo: <2 (0x2)> (expected 1 call, called 0 times)\n"
                 "\t\tfoo -> double boo: <3.3> (expected 1 call, called 0 times)\n"
                 "\tEXPECTED calls that WERE fulfilled related to function: foo\n"
                 "\t\t<none>\n"
                 "\tACTUAL unexpected parameter passed to function: foo\n"
                 "\t\tint bar: <2 (0x2)>", failure.getMessage().asCharString());
}